

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

int Gia_ObjGetCnfVar(Gia_Man_t *pGia,int iObj,Vec_Ptr_t *vFrontier,Vec_Ptr_t *vFanins,satoko_t *pSat
                    )

{
  size_t __size;
  Gia_Obj_t *pGVar1;
  Vec_Int_t *p;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  void **ppvVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  if (iObj < 0) {
LAB_0064fdd2:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar6 = pGia->nObjs;
  if ((int)uVar6 <= iObj) goto LAB_0064fdd2;
  pGVar1 = pGia->pObjs;
  uVar7 = (pGia->vCopies2).nSize;
  pGVar4 = pGVar1;
  if ((int)uVar7 < (int)uVar6) {
    iVar2 = (pGia->vCopies2).nCap;
    uVar8 = iVar2 * 2;
    if ((int)uVar8 < (int)uVar6) {
      piVar3 = (pGia->vCopies2).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar6 * 4);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(ulong)uVar6 * 4);
      }
      (pGia->vCopies2).pArray = piVar3;
      uVar8 = uVar6;
LAB_0064f6f2:
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pGia->vCopies2).nCap = uVar8;
      uVar7 = (pGia->vCopies2).nSize;
    }
    else if (iVar2 < (int)uVar6) {
      piVar3 = (pGia->vCopies2).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar8 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(ulong)uVar8 << 2);
      }
      (pGia->vCopies2).pArray = piVar3;
      goto LAB_0064f6f2;
    }
    if ((int)uVar7 < (int)uVar6) {
      memset((pGia->vCopies2).pArray + (int)uVar7,0xff,(ulong)(~uVar7 + uVar6) * 4 + 4);
    }
    (pGia->vCopies2).nSize = uVar6;
    pGVar4 = pGia->pObjs;
    uVar7 = uVar6;
  }
  pGVar1 = pGVar1 + (uint)iObj;
  if ((pGVar1 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar1)) goto LAB_0064fd56;
  uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
  if (((int)uVar6 < 0) || (uVar7 <= uVar6)) {
LAB_0064fd75:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = (pGia->vCopies2).pArray[uVar6 & 0x7fffffff];
  if (iVar2 < 0) {
    if (iObj == 0) {
      __assert_fail("iObj > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0x14a,
                    "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)");
    }
    uVar6 = (uint)*(undefined8 *)pGVar1;
    if ((~uVar6 & 0x9fffffff) == 0) {
      iVar2 = satoko_add_variable(pSat,'\0');
      p = pGia->vVar2Obj;
      if (p != (Vec_Int_t *)0x0) {
        if (p->nSize != iVar2) {
          __assert_fail("Vec_IntSize(pGia->vVar2Obj) == iVar",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x150,
                        "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
        Vec_IntPush(p,iObj);
      }
      pGVar4 = pGia->pObjs;
      if ((pGVar1 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar1)) {
LAB_0064fd56:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar6 < 0) || ((pGia->vCopies2).nSize <= (int)uVar6)) goto LAB_0064fd75;
      piVar3 = (pGia->vCopies2).pArray;
      if (piVar3[uVar6 & 0x7fffffff] != -1) {
        __assert_fail("Cec2_ObjSatId(p, pObj) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x4d,"int Cec2_ObjSetSatId(Gia_Man_t *, Gia_Obj_t *, int)");
      }
      piVar3[uVar6 & 0x7fffffff] = iVar2;
    }
    else {
      if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x155,
                      "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      vFrontier->nSize = 0;
      Cec2_ObjAddToFrontier(pGia,pGVar1,vFrontier,pSat);
      if (0 < vFrontier->nSize) {
        lVar11 = 0;
        do {
          pGVar4 = (Gia_Obj_t *)vFrontier->pArray[lVar11];
          pGVar9 = pGia->pObjs;
          if ((pGVar4 < pGVar9) || (pGVar9 + pGia->nObjs <= pGVar4)) goto LAB_0064fd56;
          uVar6 = (int)((long)pGVar4 - (long)pGVar9 >> 2) * -0x55555555;
          if (((int)uVar6 < 0) || ((pGia->vCopies2).nSize <= (int)uVar6)) goto LAB_0064fd75;
          if ((pGia->vCopies2).pArray[uVar6 & 0x7fffffff] < 0) {
            __assert_fail("Cec2_ObjSatId(pGia,pNode) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                          ,0x15d,
                          "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                         );
          }
          if ((pGVar4->field_0x3 & 0x40) == 0) {
            Cec2_CollectSuper(pGia,pGVar4,1,vFanins);
            if (0 < vFanins->nSize) {
              lVar14 = 0;
              do {
                Cec2_ObjAddToFrontier
                          (pGia,(Gia_Obj_t *)((ulong)vFanins->pArray[lVar14] & 0xfffffffffffffffe),
                           vFrontier,pSat);
                lVar14 = lVar14 + 1;
              } while (lVar14 < vFanins->nSize);
            }
            Cec2_AddClausesSuper(pGia,pGVar4,vFanins,pSat);
          }
          else {
            vFanins->nSize = 0;
            uVar13 = *(ulong *)pGVar4;
            uVar10 = *(ulong *)(pGVar4 + -(uVar13 & 0x1fffffff));
            uVar6 = vFanins->nCap;
            iVar2 = 0;
            ppvVar5 = vFanins->pArray;
            if (uVar6 == 0) {
              if (ppvVar5 == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
                iVar2 = 0;
              }
              else {
                ppvVar5 = (void **)realloc(ppvVar5,0x80);
                iVar2 = vFanins->nSize;
              }
              vFanins->pArray = ppvVar5;
              vFanins->nCap = 0x10;
              uVar6 = 0x10;
            }
            uVar7 = iVar2 + 1;
            vFanins->nSize = uVar7;
            ppvVar5[iVar2] = pGVar4 + (-(uVar13 & 0x1fffffff) - (uVar10 & 0x1fffffff));
            uVar10 = *(ulong *)pGVar4;
            pGVar9 = pGVar4 + -(uVar10 >> 0x20 & 0x1fffffff);
            uVar13 = *(ulong *)pGVar9;
            if (-1 < iVar2) {
              uVar12 = 0;
              do {
                if ((Gia_Obj_t *)vFanins->pArray[uVar12] == pGVar9 + -(uVar13 & 0x1fffffff))
                goto LAB_0064faf7;
                uVar12 = uVar12 + 1;
              } while (uVar7 != uVar12);
            }
            if (uVar7 == uVar6) {
              if ((int)uVar6 < 0x10) {
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
                }
                vFanins->pArray = ppvVar5;
                vFanins->nCap = 0x10;
                uVar6 = 0x10;
              }
              else {
                uVar6 = uVar6 * 2;
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar6 * 8);
                }
                else {
                  ppvVar5 = (void **)realloc(vFanins->pArray,(ulong)uVar6 * 8);
                }
                vFanins->pArray = ppvVar5;
                vFanins->nCap = uVar6;
              }
            }
            else {
              ppvVar5 = vFanins->pArray;
            }
            iVar2 = vFanins->nSize;
            uVar7 = iVar2 + 1;
            vFanins->nSize = uVar7;
            ppvVar5[iVar2] = pGVar9 + -(uVar13 & 0x1fffffff);
            uVar10 = *(ulong *)pGVar4;
LAB_0064faf7:
            uVar8 = *(uint *)&pGVar4[-(uVar10 & 0x1fffffff)].field_0x4;
            if (0 < (int)uVar7) {
              uVar13 = 0;
              do {
                if ((Gia_Obj_t *)vFanins->pArray[uVar13] ==
                    pGVar4 + (-(uVar10 & 0x1fffffff) - ((ulong)uVar8 & 0x1fffffff)))
                goto LAB_0064fbcb;
                uVar13 = uVar13 + 1;
              } while (uVar7 != uVar13);
            }
            if (uVar7 == uVar6) {
              if ((int)uVar6 < 0x10) {
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
                }
                vFanins->pArray = ppvVar5;
                vFanins->nCap = 0x10;
                uVar6 = 0x10;
              }
              else {
                uVar6 = uVar6 * 2;
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar6 * 8);
                }
                else {
                  ppvVar5 = (void **)realloc(vFanins->pArray,(ulong)uVar6 * 8);
                }
                vFanins->pArray = ppvVar5;
                vFanins->nCap = uVar6;
              }
            }
            else {
              ppvVar5 = vFanins->pArray;
            }
            iVar2 = vFanins->nSize;
            uVar7 = iVar2 + 1;
            vFanins->nSize = uVar7;
            ppvVar5[iVar2] = pGVar4 + (-(uVar10 & 0x1fffffff) - ((ulong)uVar8 & 0x1fffffff));
            uVar10 = *(ulong *)pGVar4;
LAB_0064fbcb:
            uVar13 = uVar10 >> 0x20 & 0x1fffffff;
            uVar8 = *(uint *)&pGVar4[-uVar13].field_0x4;
            if (0 < (int)uVar7) {
              uVar10 = 0;
              do {
                if ((Gia_Obj_t *)vFanins->pArray[uVar10] ==
                    pGVar4 + (-uVar13 - ((ulong)uVar8 & 0x1fffffff))) goto LAB_0064fc9b;
                uVar10 = uVar10 + 1;
              } while (uVar7 != uVar10);
            }
            if (uVar7 == uVar6) {
              if ((int)uVar6 < 0x10) {
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
                }
                vFanins->pArray = ppvVar5;
                vFanins->nCap = 0x10;
              }
              else {
                __size = (ulong)(uVar6 * 2) * 8;
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(__size);
                }
                else {
                  ppvVar5 = (void **)realloc(vFanins->pArray,__size);
                }
                vFanins->pArray = ppvVar5;
                vFanins->nCap = uVar6 * 2;
              }
            }
            else {
              ppvVar5 = vFanins->pArray;
            }
            iVar2 = vFanins->nSize;
            vFanins->nSize = iVar2 + 1;
            ppvVar5[iVar2] = pGVar4 + (-uVar13 - ((ulong)uVar8 & 0x1fffffff));
            if (-1 < (long)iVar2) {
LAB_0064fc9b:
              lVar14 = 0;
              do {
                Cec2_ObjAddToFrontier
                          (pGia,(Gia_Obj_t *)((ulong)vFanins->pArray[lVar14] & 0xfffffffffffffffe),
                           vFrontier,pSat);
                lVar14 = lVar14 + 1;
              } while (lVar14 < vFanins->nSize);
            }
            Cec2_AddClausesMux(pGia,pGVar4,pSat);
          }
          if (vFanins->nSize < 2) {
            __assert_fail("Vec_PtrSize(vFanins) > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                          ,0x171,
                          "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                         );
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < vFrontier->nSize);
      }
      pGVar4 = pGia->pObjs;
      if ((pGVar1 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar1)) goto LAB_0064fd56;
      uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar6 < 0) || ((pGia->vCopies2).nSize <= (int)uVar6)) goto LAB_0064fd75;
      iVar2 = (pGia->vCopies2).pArray[uVar6 & 0x7fffffff];
    }
  }
  return iVar2;
}

Assistant:

int Gia_ObjGetCnfVar( Gia_Man_t * pGia, int iObj, Vec_Ptr_t * vFrontier, Vec_Ptr_t * vFanins, satoko_t * pSat )
{ 
    Gia_Obj_t * pNode, * pFanin;
    Gia_Obj_t * pObj = Gia_ManObj(pGia, iObj);
    int i, k, fUseMuxes = 1;
    if ( Vec_IntSize(&pGia->vCopies2) < Gia_ManObjNum(pGia) )
        Vec_IntFillExtra( &pGia->vCopies2, Gia_ManObjNum(pGia), -1 );
    // quit if CNF is ready
    if ( Cec2_ObjSatId(pGia,pObj) >= 0 )
        return Cec2_ObjSatId(pGia,pObj);
    assert( iObj > 0 );
    if ( Gia_ObjIsCi(pObj) )
    {
        int iVar = satoko_add_variable(pSat, 0);
        if ( pGia->vVar2Obj )
        {
            assert( Vec_IntSize(pGia->vVar2Obj) == iVar );
            Vec_IntPush( pGia->vVar2Obj, iObj );
        }
        return Cec2_ObjSetSatId( pGia, pObj, iVar );
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    Vec_PtrClear( vFrontier );
    Cec2_ObjAddToFrontier( pGia, pObj, vFrontier, pSat );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec2_ObjSatId(pGia,pNode) >= 0 );
        if ( fUseMuxes && pNode->fMark0 )
        {
            Vec_PtrClear( vFanins );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesMux( pGia, pNode, pSat );
        }
        else
        {
            Cec2_CollectSuper( pGia, pNode, fUseMuxes, vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesSuper( pGia, pNode, vFanins, pSat ); 
            //printf( "%d ", Vec_PtrSize(vFanins) );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
    }
    return Cec2_ObjSatId(pGia,pObj);
}